

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

uint8_t read_varuint7(uint8_t **cursor,uint8_t *end)

{
  string local_40;
  byte local_19;
  uint8_t *puStack_18;
  uint8_t result;
  uint8_t *end_local;
  uint8_t **cursor_local;
  
  puStack_18 = end;
  end_local = (uint8_t *)cursor;
  local_19 = read_byte(cursor,end);
  if ((local_19 & 0x80) != 0) {
    StringFormat_abi_cxx11_(&local_40,"malformed %d",0x12a);
    ThrowString(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return local_19;
}

Assistant:

uint8_t read_varuint7 (uint8_t** cursor, const uint8_t* end)
{
    const uint8_t result = read_byte (cursor, end);
    if (result & 0x80)
        ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    return result;
}